

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall
kj::HashIndex<kj::HashMap<kj::String,int>::Callbacks>::
move<kj::HashMap<kj::String,int>::Entry,kj::String&>
          (HashIndex<kj::HashMap<kj::String,int>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::String,_int>::Entry> table,size_t oldPos,size_t newPos,
          String *params)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar2 = hashCode<kj::String&>(params);
  uVar3 = (int)*(long *)(this + 0x18) - 1U & uVar2;
  while( true ) {
    uVar4 = (ulong)uVar3;
    iVar1 = *(int *)(*(long *)(this + 0x10) + 4 + uVar4 * 8);
    if ((int)oldPos + 2 == iVar1) {
      *(int *)(*(long *)(this + 0x10) + 4 + uVar4 * 8) = (int)newPos + 2;
      return;
    }
    if (iVar1 == 0) break;
    uVar3 = (uint)(uVar4 + 1);
    if (uVar4 + 1 == *(long *)(this + 0x18)) {
      uVar3 = 0;
    }
  }
  _::logHashTableInconsistency();
  return;
}

Assistant:

void move(kj::ArrayPtr<Row> table, size_t oldPos, size_t newPos, Params&&... params) {
    uint hashCode = cb.hashCode(params...);
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isPos(oldPos)) {
        // found it
        bucket.setPos(newPos);
        return;
      } else if (bucket.isEmpty()) {
        // can't find the bucket, something is very wrong
        _::logHashTableInconsistency();
        return;
      }
    }
  }